

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::CallIndirectExpr::CallIndirectExpr(CallIndirectExpr *this,Location *loc)

{
  Location *loc_local;
  CallIndirectExpr *this_local;
  
  ExprMixin<(wabt::ExprType)13>::ExprMixin(&this->super_ExprMixin<(wabt::ExprType)13>,loc);
  (this->super_ExprMixin<(wabt::ExprType)13>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__CallIndirectExpr_002d9070;
  FuncDeclaration::FuncDeclaration(&this->decl);
  Var::Var(&this->table);
  return;
}

Assistant:

explicit CallIndirectExpr(const Location& loc = Location())
      : ExprMixin<ExprType::CallIndirect>(loc) {}